

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O2

bool output_buffer(DESCRIPTOR_DATA *d)

{
  short sVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  size_t sVar8;
  bool bVar9;
  char *pcVar10;
  int iVar11;
  bool bVar12;
  char *pcVar13;
  int iVar14;
  char *__s;
  bool bVar15;
  int local_12d8;
  int local_12c4;
  char buf2 [128];
  char buf [4608];
  
  if (d == (DESCRIPTOR_DATA *)0x0) {
    return false;
  }
  __s = buf;
  memset(__s,0,0x1200);
  pcVar13 = d->outbuf;
  bVar15 = false;
  local_12d8 = 7;
  local_12c4 = local_12d8;
  bVar7 = false;
  bVar6 = false;
  bVar2 = false;
  bVar9 = false;
LAB_002d7475:
  pcVar10 = pcVar13;
  pcVar13 = pcVar13 + 2;
  do {
    cVar5 = pcVar13[-2];
    if ((cVar5 == '\0') || ((long)d->outtop <= (long)pcVar10 - (long)d->outbuf)) {
      *__s = '\0';
      sVar1 = d->descriptor;
      sVar8 = strlen(buf);
      bVar6 = write_to_descriptor((int)sVar1,buf,(int)sVar8);
LAB_002d7887:
      d->outtop = 0;
      return bVar6;
    }
    if (0x11df < (int)__s - (int)buf) {
      *__s = '\0';
      sVar1 = d->descriptor;
      sVar8 = strlen(buf);
      bVar4 = write_to_descriptor((int)sVar1,buf,(int)sVar8);
      if (!bVar4) {
        __s[1] = '\0';
        bVar6 = false;
        goto LAB_002d7887;
      }
      memset(buf,0,0x1200);
      cVar5 = pcVar13[-2];
      __s = buf;
    }
    if (cVar5 == '{') break;
    *__s = cVar5;
    __s = __s + 1;
    pcVar13 = pcVar13 + 1;
    pcVar10 = pcVar10 + 1;
    bVar15 = false;
  } while( true );
  cVar5 = pcVar13[-1];
  iVar14 = local_12d8;
  bVar4 = bVar6;
  bVar12 = bVar9;
  if ((bVar15) ||
     (iVar14 = local_12c4, iVar11 = local_12d8, bVar4 = bVar7, bVar15 = bVar6, bVar12 = bVar2,
     bVar3 = bVar9, cVar5 != '<')) {
    local_12d8 = iVar14;
    iVar11 = local_12c4;
    bVar6 = bVar7;
    bVar15 = bVar4;
    bVar9 = bVar2;
    bVar3 = bVar12;
    switch(cVar5) {
    case '-':
      buf2[0] = '~';
      buf2[1] = '\0';
      goto LAB_002d7806;
    case '.':
    case '/':
    case '8':
    case '9':
    case ':':
    case ';':
    case '=':
    case '>':
    case '?':
    case '@':
    case 'A':
    case 'C':
    case 'D':
    case 'E':
switchD_002d757a_caseD_2e:
      sprintf(buf2,"{%c");
      goto LAB_002d7806;
    case '0':
      iVar11 = 0;
      break;
    case '1':
      iVar11 = 1;
      break;
    case '2':
      iVar11 = 2;
      break;
    case '3':
      iVar11 = 3;
      break;
    case '4':
      iVar11 = 4;
      break;
    case '5':
      iVar11 = 5;
      break;
    case '6':
      iVar11 = 6;
      break;
    case '7':
      iVar11 = 7;
      break;
    case '<':
      iVar11 = iVar14;
      bVar6 = bVar4;
      bVar9 = bVar12;
      break;
    case 'B':
      bVar6 = true;
      break;
    case 'F':
      bVar9 = true;
      break;
    default:
      if (cVar5 == 'b') {
        bVar6 = false;
      }
      else {
        if (cVar5 != 'f') {
          if (cVar5 == 'n') {
            if ((d->character == (CHAR_DATA *)0x0) || (bVar6 = is_ansi(d->character), !bVar6)) {
              buf2._0_4_ = buf2._0_4_ & 0xffffff00;
            }
            else {
              builtin_strncpy(buf2,"\x1b[m",4);
            }
            local_12c4 = 7;
            bVar6 = false;
            bVar9 = false;
            goto LAB_002d7806;
          }
          if (cVar5 == 'x') {
            buf2[0] = '{';
            buf2[1] = '\0';
            goto LAB_002d7806;
          }
          goto switchD_002d757a_caseD_2e;
        }
        bVar9 = false;
      }
    }
  }
  bVar12 = bVar3;
  bVar4 = bVar15;
  local_12c4 = iVar11;
  if ((d->character == (CHAR_DATA *)0x0) || (bVar7 = is_ansi(d->character), !bVar7)) {
    buf2._0_4_ = buf2._0_4_ & 0xffffff00;
  }
  else {
    pcVar10 = color_value_string(iVar11,bVar6,bVar9);
    strcpy(buf2,pcVar10);
  }
LAB_002d7806:
  for (pcVar10 = buf2; cVar5 = *pcVar10, *__s = cVar5, cVar5 != '\0'; pcVar10 = pcVar10 + 1) {
    __s = __s + 1;
  }
  bVar15 = true;
  bVar7 = bVar6;
  bVar6 = bVar4;
  bVar2 = bVar9;
  bVar9 = bVar12;
  goto LAB_002d7475;
}

Assistant:

bool output_buffer(DESCRIPTOR_DATA *d)
{
	char buf[MAX_STRING_LENGTH];
	char buf2[128];
	const char *str;
	char *i;
	char *point;
	bool flash= false, o_flash, bold= false, o_bold;
	bool act= false, ok = true, color_code= false;
	int color = 7, o_color;

	/* discard nullptr descriptor */
	if (d == nullptr)
		return false;

	memset(buf, '\0', MAX_STRING_LENGTH);
	point = buf;
	str = d->outbuf;
	o_color = color;
	o_bold = bold;
	o_flash = flash;

	while (*str != '\0' && (str - d->outbuf) < d->outtop)
	{
		if ((int)(point - buf) >= MAX_STRING_LENGTH - 32)
		{
			/* buffer is full, so send it through the socket */
			*point++ = '\0';

			if (!(ok = write_to_descriptor(d->descriptor, buf, strlen(buf))))
				break;

			memset(buf, '\0', MAX_STRING_LENGTH);
			point = buf;
		}

		if (*str != '{')
		{
			color_code= false;
			*point++ = *str++;
			continue;
		}

		if (!color_code && *(str + 1) != '<')
		{
			o_color = color;
			o_bold = bold;
			o_flash = flash;
		}

		color_code = true;
		act= false;
		str++;

		switch (*str)
		{
			case 'x':
				sprintf(buf2, "{");
				break;
			case '-':
				sprintf(buf2, "~");
				break;
			case '<':
				color = o_color;
				bold = o_bold;
				flash = o_flash;
				act = true;
				break;
			case '0':
				color = 0;
				act = true;
				break;
			case '1':
				color = 1;
				act = true;
				break;
			case '2':
				color = 2;
				act = true;
				break;
			case '3':
				color = 3;
				act = true;
				break;
			case '4':
				color = 4;
				act = true;
				break;
			case '5':
				color = 5;
				act = true;
				break;
			case '6':
				color = 6;
				act = true;
				break;
			case '7':
				color = 7;
				act = true;
				break;
			case 'B':
				bold = true;
				act = true;
				break;
			case 'b':
				bold= false;
				act = true;
				break;
			case 'F':
				flash = true;
				act = true;
				break;
			case 'f':
				flash= false;
				act = true;
				break;
			case 'n':
				if (d->character && is_ansi(d->character))
					sprintf(buf2, "%s", ANSI_NORMAL);
				else
					buf2[0] = '\0';

				bold= false;
				color = 7;
				flash= false;
				break;
			default:
				sprintf(buf2, "{%c", *str);
				break;
		}

		if (act)
		{
			if (d->character && is_ansi(d->character))
			{
				sprintf(buf2, "%s", color_value_string(color, bold, flash));
				color_code = true;
			}
			else
			{
				buf2[0] = '\0';
			}
		}

		i = buf2;
		str++;
		while ((*point = *i) != '\0')
		{
			++point, ++i;
		}
	}

	*point++ = '\0';
	ok = ok && (write_to_descriptor(d->descriptor, buf, strlen(buf)));
	d->outtop = 0;

	return ok;
}